

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

void start_scope(LinearizerState *linearizer,Proc *proc,Scope *scope)

{
  uint uVar1;
  ravitype_t type;
  long lVar2;
  int iVar3;
  Proc *pPVar4;
  Scope *pSVar5;
  uint uVar6;
  ulong uVar7;
  PtrListIterator symiter__;
  PtrListIterator local_30;
  
  (linearizer->C_declarations).pos = (size_t)proc;
  raviX_ptrlist_forward_iterator(&local_30,*(PtrList **)&proc->id);
  pPVar4 = (Proc *)raviX_ptrlist_iter_next(&local_30);
  if (pPVar4 == (Proc *)0x0) {
    return;
  }
LAB_001175b0:
  if (pPVar4->node_count == 0) {
    if ((((ulong)pPVar4->function_expr & 3) != 0) ||
       ((type = *(ravitype_t *)&pPVar4->nodes, type != RAVI_TNUMFLT && (type != RAVI_TNUMINT)))) {
      uVar6 = 3;
      iVar3 = -0x101;
LAB_001175cb:
      if ((&linearizer[1].current_proc)[uVar6] == (Proc *)0x0) goto code_r0x001175d7;
      uVar7 = (ulong)(&linearizer[1].current_proc)[uVar6] >> 1;
      if (uVar7 == 0) {
        uVar6 = 0x40;
      }
      else {
        lVar2 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar6 = (uint)lVar2 ^ 0x3f;
      }
      uVar6 = -(uVar6 + iVar3);
      goto LAB_00117622;
    }
    pSVar5 = (Scope *)allocate_temp_pseudo((Proc *)linearizer,type,true);
    pPVar4->current_scope = pSVar5;
    ((anon_union_40_9_1ec7a544_for_Pseudo_3 *)&pSVar5->parent)->proc = pPVar4;
  }
  goto LAB_0011765d;
code_r0x001175d7:
  uVar6 = uVar6 - 1;
  iVar3 = iVar3 + 0x40;
  if (iVar3 == -1) goto code_r0x001175e1;
  goto LAB_001175cb;
code_r0x001175e1:
  uVar6 = 0;
LAB_00117622:
  (&linearizer[1].current_proc)[uVar6 >> 6] =
       (Proc *)((ulong)(&linearizer[1].current_proc)[uVar6 >> 6] | 1L << ((byte)uVar6 & 0x3f));
  uVar1 = (uint)linearizer[1].C_declarations.pos;
  if (uVar1 < uVar6) {
    __assert_fail("reg <= generator->max_reg",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0xac,"unsigned int pseudo_gen_alloc(PseudoGenerator *, _Bool)");
  }
  if (uVar6 == uVar1) {
    *(uint *)&linearizer[1].C_declarations.pos = uVar6 + 1;
  }
  allocate_symbol_pseudo
            (*(Proc **)**(long **)linearizer->current_proc,
             (LuaSymbol *)((undefined8 *)**(long **)linearizer->current_proc)[2],(uint)pPVar4);
LAB_0011765d:
  pPVar4 = (Proc *)raviX_ptrlist_iter_next(&local_30);
  if (pPVar4 == (Proc *)0x0) {
    return;
  }
  goto LAB_001175b0;
}

Assistant:

static void start_scope(LinearizerState *linearizer, Proc *proc, Scope *scope)
{
	proc->current_scope = scope;
	LuaSymbol *sym;
	FOR_EACH_PTR(scope->symbol_list, LuaSymbol, sym)
	{
		if (sym->symbol_type == SYM_LOCAL) {
			uint8_t reg;
			if (!sym->variable.escaped && !sym->variable.function_parameter &&
			    (sym->variable.value_type.type_code == RAVI_TNUMFLT ||
			     sym->variable.value_type.type_code == RAVI_TNUMINT)) {
				Pseudo *pseudo;
				if (sym->variable.value_type.type_code == RAVI_TNUMFLT)
					pseudo = allocate_temp_pseudo(proc, RAVI_TNUMFLT, true);
				else
					pseudo = allocate_temp_pseudo(proc, RAVI_TNUMINT, true);
				sym->variable.pseudo = pseudo;
				pseudo->temp_for_local = sym; /* Note that this temp is for a local */
			}
			else {
				reg = allocate_register(&proc->local_pseudos, true);
				allocate_symbol_pseudo(proc, sym, reg);
			}
		}
	}
	END_FOR_EACH_PTR(sym)
}